

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O0

shared_ptr<const_Diligent::ShaderResourcesGL> * __thiscall
Diligent::GLProgram::LoadResources
          (GLProgram *this,SHADER_TYPE ShaderStages,PIPELINE_RESOURCE_FLAGS SamplerResourceFlag,
          GLContextState *State,bool LoadUniformBufferReflection,SHADER_SOURCE_LANGUAGE SourceLang)

{
  bool bVar1;
  Char *pCVar2;
  pointer pSVar3;
  LoadUniformsAttribs local_a0;
  unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>
  local_80;
  unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>
  pResources;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  SHADER_SOURCE_LANGUAGE SourceLang_local;
  bool LoadUniformBufferReflection_local;
  GLContextState *State_local;
  PIPELINE_RESOURCE_FLAGS SamplerResourceFlag_local;
  SHADER_TYPE ShaderStages_local;
  GLProgram *this_local;
  
  msg.field_2._8_4_ = SourceLang;
  msg.field_2._M_local_buf[0xf] = LoadUniformBufferReflection;
  if (this->m_LinkStatus != Succeeded) {
    FormatString<char[54]>
              ((string *)local_48,
               (char (*) [54])"Program must be successfully linked to load resources");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"LoadResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x90);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = std::operator==(&this->m_pResources,(nullptr_t)0x0);
  if (!bVar1) {
    FormatString<char[35]>
              ((string *)&pResources,(char (*) [35])"Resources have already been loaded");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"LoadResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x91);
    std::__cxx11::string::~string((string *)&pResources);
  }
  std::make_unique<Diligent::ShaderResourcesGL>();
  pSVar3 = std::
           unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>
           ::operator->(&local_80);
  local_a0.LoadUniformBufferReflection = (bool)(msg.field_2._M_local_buf[0xf] & 1);
  local_a0.SourceLang = msg.field_2._8_4_;
  local_a0.ShaderStages = ShaderStages;
  local_a0.SamplerResourceFlag = SamplerResourceFlag;
  local_a0.GLProgram = &this->m_GLProg;
  local_a0.State = State;
  ShaderResourcesGL::LoadUniforms(pSVar3,&local_a0);
  pSVar3 = std::
           unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>
           ::release(&local_80);
  std::__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>::
  reset<Diligent::ShaderResourcesGL>
            (&(this->m_pResources).
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>,
             pSVar3);
  std::unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>::
  ~unique_ptr(&local_80);
  return &this->m_pResources;
}

Assistant:

std::shared_ptr<const ShaderResourcesGL>& GLProgram::LoadResources(SHADER_TYPE             ShaderStages,
                                                                   PIPELINE_RESOURCE_FLAGS SamplerResourceFlag,
                                                                   GLContextState&         State,
                                                                   bool                    LoadUniformBufferReflection,
                                                                   SHADER_SOURCE_LANGUAGE  SourceLang)
{
    DEV_CHECK_ERR(m_LinkStatus == LinkStatus::Succeeded, "Program must be successfully linked to load resources");
    VERIFY(m_pResources == nullptr, "Resources have already been loaded");

    std::unique_ptr<ShaderResourcesGL> pResources = std::make_unique<ShaderResourcesGL>();
    pResources->LoadUniforms(
        {
            ShaderStages,
            SamplerResourceFlag,
            m_GLProg,
            State,
            LoadUniformBufferReflection,
            SourceLang,
        });
    m_pResources.reset(pResources.release());

    return m_pResources;
}